

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O2

bool dxil_spv::emit_create_handle
               (Impl *impl,CallInst *instruction,ResourceType resource_type,uint resource_range,
               Value *instruction_offset,bool non_uniform)

{
  uint32_t uVar1;
  mapped_type mVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  pointer pRVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  CallInst *instruction_00;
  undefined2 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  undefined4 uVar14;
  bool bVar15;
  byte bVar16;
  uint uVar17;
  Id IVar18;
  Id IVar19;
  StorageClass SVar20;
  Dim DVar21;
  Id IVar22;
  Builder *pBVar23;
  Builder *this;
  ResourceReference *pRVar24;
  mapped_type *pmVar25;
  mapped_type *pmVar26;
  LoggingCallback p_Var27;
  void *pvVar28;
  pointer pLVar29;
  mapped_type *pmVar30;
  undefined8 uVar31;
  size_type sVar32;
  mapped_type *pmVar33;
  Operation *pOVar34;
  Operation *pOVar35;
  Value *dynamic_offset;
  undefined7 in_register_00000011;
  Capability CVar36;
  long lVar37;
  char *__ptr;
  DescriptorQATypeFlagBits DVar38;
  ResourceReference *reference;
  RawDeclarationVariable *alias;
  pointer pRVar39;
  bool is_non_uniform_3;
  Id loaded_id;
  Id resource_id_1;
  Id resource_id;
  bool is_non_uniform;
  ResourceMetaInstrumentation instrumentation;
  Id ptr_id;
  undefined4 uStack_1064;
  pointer pRStack_1060;
  pointer local_1058;
  CallInst *local_1048;
  Builder *local_1040;
  char buffer [4096];
  
  pBVar23 = Converter::Impl::builder(impl);
  DVar38 = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
  switch(CONCAT71(in_register_00000011,resource_type) & 0xffffffff) {
  case 0:
    pRVar24 = get_resource_reference(impl,SRV,instruction,resource_range);
    if (pRVar24->resource_kind == RTAccelerationStructure) {
      this = Converter::Impl::builder(impl);
      SVar20 = spv::Builder::getStorageClass(this,pRVar24->var_id);
      if (SVar20 == StorageClassStorageBuffer) {
LAB_001529bf:
        pBVar23 = Converter::Impl::builder(impl);
        SVar20 = spv::Builder::getStorageClass(pBVar23,pRVar24->var_id);
        if (SVar20 == StorageClassStorageBuffer) {
          dynamic_offset = (Value *)0x0;
          if (pRVar24->base_resource_is_array != false) {
            dynamic_offset = instruction_offset;
          }
          IVar19 = build_bindless_heap_offset(impl,pRVar24,0x140,dynamic_offset);
          if (!non_uniform) {
            spv::Builder::addCapability(pBVar23,CapabilityGroupNonUniformBallot);
            IVar22 = spv::Builder::makeUintType(pBVar23,0x20);
            pOVar34 = Converter::Impl::allocate(impl,OpGroupNonUniformBroadcastFirst,IVar22);
            IVar22 = spv::Builder::makeUintConstant(pBVar23,3,false);
            Operation::add_id(pOVar34,IVar22);
            Operation::add_id(pOVar34,IVar19);
            Converter::Impl::add(impl,pOVar34,false);
            IVar19 = pOVar34->id;
          }
          IVar19 = build_physical_address_indexing_from_ssbo(impl,IVar19);
          IVar22 = spv::Builder::makeUintType(pBVar23,0x20);
          IVar22 = spv::Builder::makeVectorType(pBVar23,IVar22,2);
          IVar18 = spv::Builder::makePointer(pBVar23,StorageClassStorageBuffer,IVar22);
          pOVar34 = Converter::Impl::allocate(impl,OpAccessChain,IVar18);
          Operation::add_id(pOVar34,pRVar24->var_id);
          IVar18 = spv::Builder::makeUintConstant(pBVar23,0,false);
          Operation::add_id(pOVar34,IVar18);
          Operation::add_id(pOVar34,IVar19);
          Converter::Impl::add(impl,pOVar34,false);
          pOVar35 = Converter::Impl::allocate(impl,OpLoad,IVar22);
          Operation::add_id(pOVar35,pOVar34->id);
          Converter::Impl::add(impl,pOVar35,false);
          IVar19 = pOVar35->id;
        }
        else {
          IVar19 = build_root_descriptor_load_physical_pointer(impl,pRVar24);
        }
        IVar22 = spv::Builder::makeAccelerationStructureType(pBVar23);
        pOVar34 = Converter::Impl::allocate(impl,OpConvertUToAccelerationStructureKHR,IVar22);
        Operation::add_id(pOVar34,IVar19);
        Converter::Impl::add(impl,pOVar34,false);
        _ptr_id = (pointer)CONCAT44(uStack_1064,pOVar34->id);
        Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar34->id);
        pmVar25 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->handle_to_resource_meta,&ptr_id);
        buffer[0] = '\0';
        buffer[1] = '\0';
        buffer[4] = '\0';
        buffer[5] = '\0';
        buffer[6] = '\0';
        buffer[7] = '\0';
        buffer[8] = '\0';
        buffer[9] = '\0';
        buffer[10] = '\0';
        buffer[0xb] = '\0';
        buffer[0xc] = '\0';
        buffer[0xd] = '\0';
        buffer[0xe] = '\0';
        buffer[0xf] = '\0';
        buffer[0x10] = '\0';
        buffer[0x11] = '\0';
        buffer[0x12] = '\0';
        buffer[0x13] = '\0';
        buffer[0x14] = '\0';
        buffer[0x15] = '\0';
        buffer[0x16] = '\0';
        buffer[0x17] = '\0';
        buffer[0x18] = '\0';
        buffer[0x19] = '\0';
        buffer[0x1a] = '\0';
        buffer[0x1b] = '\0';
        buffer[0x1c] = '\0';
        buffer[0x1d] = '\0';
        buffer[0x1e] = '\0';
        buffer[0x1f] = '\0';
        buffer[0x20] = '\0';
        buffer[0x21] = '\0';
        buffer[0x22] = '\0';
        buffer[0x23] = '\0';
        buffer[0x24] = '\0';
        buffer[0x25] = '\0';
        buffer[0x26] = '\0';
        buffer[0x27] = '\0';
        buffer[0x28] = '\0';
        buffer[0x29] = '\0';
        buffer[0x2a] = '\0';
        buffer[0x2b] = '\0';
        buffer[0x2c] = '\0';
        buffer[0x2d] = '\0';
        buffer[0x2e] = '\0';
        buffer[0x2f] = '\0';
        buffer[0x30] = '\0';
        buffer[0x31] = '\0';
        buffer[0x32] = '\0';
        buffer[0x33] = '\0';
        buffer[0x34] = '\0';
        buffer[0x35] = '\0';
        buffer[0x36] = '\0';
        buffer[0x37] = '\0';
        buffer[0x38] = '\0';
        buffer[0x3c] = '\0';
        buffer[0x3d] = '\0';
        buffer[0x3e] = '\0';
        buffer[0x3f] = '\0';
        buffer[0x40] = '\0';
        buffer[0x41] = '\0';
        buffer[0x42] = '\0';
        buffer[0x43] = '\0';
        buffer[0x44] = '\0';
        buffer[0x45] = '\0';
        buffer[0x46] = '\0';
        buffer[0x47] = '\0';
        buffer[0x48] = '\0';
        buffer[0x49] = '\0';
        buffer[0x4a] = '\0';
        buffer[0x4b] = '\0';
        buffer[0x4c] = '\0';
        buffer[0x4d] = '\0';
        buffer[0x4e] = '\0';
        buffer[0x4f] = '\0';
        Converter::Impl::ResourceMeta::operator=(pmVar25,(ResourceMeta *)buffer);
        std::
        _Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::~_Vector_base((_Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                         *)(buffer + 0x10));
        pmVar25->storage = StorageClassGeneric;
        pmVar25->kind = RTAccelerationStructure;
        return true;
      }
      uVar17 = pRVar24->local_root_signature_entry;
      if ((long)(int)uVar17 < 0) {
        if (pRVar24->root_descriptor == true) goto LAB_001529bf;
        goto LAB_00152b0c;
      }
      if ((impl->local_root_signature).
          super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
          ._M_impl.super__Vector_impl_data._M_start[(int)uVar17].type == Descriptor)
      goto LAB_001529bf;
LAB_00152593:
      if ((impl->local_root_signature).
          super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar17].type == Descriptor) {
LAB_001525aa:
        IVar19 = build_root_descriptor_load_physical_pointer(impl,pRVar24);
        _ptr_id = (pointer)CONCAT44(uStack_1064,IVar19);
        Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar19);
        pmVar25 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->handle_to_resource_meta,&ptr_id);
        buffer[0] = '\0';
        buffer[1] = '\0';
        buffer[4] = '\0';
        buffer[5] = '\0';
        buffer[6] = '\0';
        buffer[7] = '\0';
        buffer[8] = '\0';
        buffer[9] = '\0';
        buffer[10] = '\0';
        buffer[0xb] = '\0';
        buffer[0xc] = '\0';
        buffer[0xd] = '\0';
        buffer[0xe] = '\0';
        buffer[0xf] = '\0';
        buffer[0x10] = '\0';
        buffer[0x11] = '\0';
        buffer[0x12] = '\0';
        buffer[0x13] = '\0';
        buffer[0x14] = '\0';
        buffer[0x15] = '\0';
        buffer[0x16] = '\0';
        buffer[0x17] = '\0';
        buffer[0x18] = '\0';
        buffer[0x19] = '\0';
        buffer[0x1a] = '\0';
        buffer[0x1b] = '\0';
        buffer[0x1c] = '\0';
        buffer[0x1d] = '\0';
        buffer[0x1e] = '\0';
        buffer[0x1f] = '\0';
        buffer[0x20] = '\0';
        buffer[0x21] = '\0';
        buffer[0x22] = '\0';
        buffer[0x23] = '\0';
        buffer[0x24] = '\0';
        buffer[0x25] = '\0';
        buffer[0x26] = '\0';
        buffer[0x27] = '\0';
        buffer[0x28] = '\0';
        buffer[0x29] = '\0';
        buffer[0x2a] = '\0';
        buffer[0x2b] = '\0';
        buffer[0x2c] = '\0';
        buffer[0x2d] = '\0';
        buffer[0x2e] = '\0';
        buffer[0x2f] = '\0';
        buffer[0x30] = '\0';
        buffer[0x31] = '\0';
        buffer[0x32] = '\0';
        buffer[0x33] = '\0';
        buffer[0x34] = '\0';
        buffer[0x35] = '\0';
        buffer[0x36] = '\0';
        buffer[0x37] = '\0';
        buffer[0x38] = '\0';
        buffer[0x3c] = '\0';
        buffer[0x3d] = '\0';
        buffer[0x3e] = '\0';
        buffer[0x3f] = '\0';
        buffer[0x40] = '\0';
        buffer[0x41] = '\0';
        buffer[0x42] = '\0';
        buffer[0x43] = '\0';
        buffer[0x44] = '\0';
        buffer[0x45] = '\0';
        buffer[0x46] = '\0';
        buffer[0x47] = '\0';
        buffer[0x48] = '\0';
        buffer[0x49] = '\0';
        buffer[0x4a] = '\0';
        buffer[0x4b] = '\0';
        buffer[0x4c] = '\0';
        buffer[0x4d] = '\0';
        buffer[0x4e] = '\0';
        buffer[0x4f] = '\0';
        Converter::Impl::ResourceMeta::operator=(pmVar25,(ResourceMeta *)buffer);
        std::
        _Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::~_Vector_base((_Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                         *)(buffer + 0x10));
        pmVar25->stride = pRVar24->stride;
        pmVar25->storage = StorageClassPhysicalStorageBuffer;
        (pmVar25->physical_pointer_meta).nonwritable = true;
        pmVar25->kind = pRVar24->resource_kind;
        return true;
      }
    }
    else {
      uVar17 = pRVar24->local_root_signature_entry;
      if (-1 < (int)uVar17) goto LAB_00152593;
LAB_00152b0c:
      if (pRVar24->root_descriptor == true) goto LAB_001525aa;
    }
    _is_non_uniform = _is_non_uniform & 0xffffff00;
    IVar19 = pRVar24->var_id;
    if (IVar19 == 0) {
      pRVar39 = (pRVar24->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pRVar39 ==
          (pRVar24->var_alias_group).
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        IVar19 = 0;
      }
      else {
        IVar19 = pRVar39->var_id;
      }
    }
    SVar20 = get_resource_storage_class(impl,IVar19);
    if (SVar20 != StorageClassStorageBuffer) {
      if ((byte)(pRVar24->resource_kind - TypedBuffer) < 4) {
        DVar38 = DESCRIPTOR_QA_TYPE_UNIFORM_TEXEL_BUFFER_BIT;
      }
      else {
        DVar38 = DESCRIPTOR_QA_TYPE_RT_ACCELERATION_STRUCTURE_BIT;
        if (pRVar24->resource_kind != RTAccelerationStructure) {
          DVar38 = DESCRIPTOR_QA_TYPE_SAMPLED_IMAGE_BIT;
        }
      }
    }
    local_1058 = (pointer)0x0;
    loaded_id = 0;
    resource_id_1 = 0;
    _ptr_id = (pointer)0x0;
    pRStack_1060 = (pointer)0x0;
    resource_id = 0;
    local_1040 = pBVar23;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::reserve((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
               *)&ptr_id,
              (long)(pRVar24->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pRVar24->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
    instrumentation.resource_size_id = 0;
    instrumentation.bda_id = 0;
    instrumentation.elem_size_id = 0;
    IVar19 = pRVar24->var_id;
    if ((IVar19 == 0) ||
       (resource_id = IVar19,
       bVar15 = build_load_resource_handle
                          (impl,IVar19,pRVar24,DVar38,instruction,instruction_offset,non_uniform,
                           &is_non_uniform,(Id *)0x0,&loaded_id,&resource_id_1,&instrumentation),
       bVar15)) {
      pRVar6 = (pRVar24->var_alias_group).
               super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pRVar39 = (pRVar24->var_alias_group).
                     super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                     ._M_impl.super__Vector_impl_data._M_start; pRVar39 != pRVar6;
          pRVar39 = pRVar39 + 1) {
        resource_id = pRVar39->var_id;
        bVar15 = build_load_resource_handle
                           (impl,resource_id,pRVar24,DVar38,instruction,instruction_offset,
                            non_uniform,&is_non_uniform,(Id *)0x0,&loaded_id,&resource_id_1,
                            &instrumentation);
        if (!bVar15) goto LAB_00152e76;
        buffer._8_4_ = (pRVar39->declaration).vecsize;
        uVar4 = (pRVar39->declaration).type;
        uVar8 = (pRVar39->declaration).width;
        buffer._0_2_ = (undefined2)uVar4;
        buffer._2_2_ = (undefined2)((uint)uVar4 >> 0x10);
        buffer[0xc] = (undefined1)loaded_id;
        buffer[0xd] = loaded_id._1_1_;
        buffer[0xe] = loaded_id._2_1_;
        buffer[0xf] = loaded_id._3_1_;
        buffer._4_4_ = uVar8;
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::emplace_back<dxil_spv::Converter::Impl::RawDeclarationVariable>
                  ((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    *)&ptr_id,(RawDeclarationVariable *)buffer);
      }
      pmVar25 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&resource_id);
      IVar22 = 0;
      IVar19 = get_offset_buffer_variable(impl,SRV,instruction,resource_range);
      if (IVar19 != 0) {
        IVar22 = build_load_buffer_offset(impl,pRVar24,pmVar25,IVar19,resource_id_1,non_uniform);
      }
      resource_id_1 = IVar22;
      pmVar26 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&loaded_id);
      Converter::Impl::ResourceMeta::operator=(pmVar26,pmVar25);
      bVar15 = is_non_uniform;
      pmVar26->non_uniform = is_non_uniform;
      pmVar26->index_offset_id = resource_id_1;
      std::
      vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::_M_move_assign(&pmVar26->var_alias_group,&ptr_id);
      pBVar23 = local_1040;
      pmVar26->aliased = pRVar24->aliased;
      (pmVar26->physical_pointer_meta).nonwritable = true;
      (pmVar26->instrumentation).resource_size_id = instrumentation.resource_size_id;
      (pmVar26->instrumentation).bda_id = instrumentation.bda_id;
      (pmVar26->instrumentation).elem_size_id = instrumentation.elem_size_id;
      if (pRVar24->bindless == true) {
        pmVar26->stride = pRVar24->stride;
      }
      if (bVar15 == false) goto LAB_00153471;
      IVar19 = spv::Builder::getDerefTypeId(local_1040,resource_id);
      IVar19 = spv::Builder::getContainedTypeId(pBVar23,IVar19);
      if ((pBVar23->module).idToInstruction.
          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start[IVar19]->opCode !=
          OpTypeAccelerationStructureKHR) {
        CVar36 = CapabilityStorageBufferArrayNonUniformIndexing;
        if (pmVar26->storage != StorageClassStorageBuffer) {
          DVar21 = spv::Builder::getTypeDimensionality(pBVar23,IVar19);
          CVar36 = (uint)(DVar21 == DimBuffer) * 4 + CapabilitySampledImageArrayNonUniformIndexing;
        }
        spv::Builder::addCapability(pBVar23,CVar36);
      }
LAB_00152fc7:
      spv::Builder::addExtension(pBVar23,"SPV_EXT_descriptor_indexing");
LAB_00153471:
      std::
      _Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::~_Vector_base((_Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                       *)&ptr_id);
      return true;
    }
LAB_00152e76:
    p_Var27 = get_thread_log_callback();
    if (p_Var27 != (LoggingCallback)0x0) {
      builtin_strncpy(buffer + 0x10,"RV r",4);
      buffer[0xc] = 'a';
      buffer[0xd] = 'd';
      buffer[0xe] = ' ';
      buffer[0xf] = 'S';
      goto LAB_0015317c;
    }
    __ptr = "[ERROR]: Failed to load SRV resource handle.\n";
LAB_00153556:
    fwrite(__ptr,0x2d,1,_stderr);
    fflush(_stderr);
    goto LAB_0015319e;
  case 1:
    if ((impl->ags).uav_magic_resource_type_index == resource_range) {
      IVar19 = (impl->ags).magic_ptr_id;
      if (IVar19 == 0) {
        IVar19 = SPIRVModule::allocate_id(impl->spirv_module);
        (impl->ags).magic_ptr_id = IVar19;
      }
      goto LAB_001527b4;
    }
    pRVar24 = get_resource_reference(impl,UAV,instruction,resource_range);
    if ((long)pRVar24->local_root_signature_entry < 0) {
      if (pRVar24->root_descriptor == true) goto LAB_00152675;
    }
    else if ((impl->local_root_signature).
             super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
             ._M_impl.super__Vector_impl_data._M_start[pRVar24->local_root_signature_entry].type ==
             Descriptor) {
LAB_00152675:
      IVar19 = build_root_descriptor_load_physical_pointer(impl,pRVar24);
      _ptr_id = (pointer)CONCAT44(uStack_1064,IVar19);
      Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar19);
      pmVar25 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&ptr_id);
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      buffer[0x18] = '\0';
      buffer[0x19] = '\0';
      buffer[0x1a] = '\0';
      buffer[0x1b] = '\0';
      buffer[0x1c] = '\0';
      buffer[0x1d] = '\0';
      buffer[0x1e] = '\0';
      buffer[0x1f] = '\0';
      buffer[0x20] = '\0';
      buffer[0x21] = '\0';
      buffer[0x22] = '\0';
      buffer[0x23] = '\0';
      buffer[0x24] = '\0';
      buffer[0x25] = '\0';
      buffer[0x26] = '\0';
      buffer[0x27] = '\0';
      buffer[0x28] = '\0';
      buffer[0x29] = '\0';
      buffer[0x2a] = '\0';
      buffer[0x2b] = '\0';
      buffer[0x2c] = '\0';
      buffer[0x2d] = '\0';
      buffer[0x2e] = '\0';
      buffer[0x2f] = '\0';
      buffer[0x30] = '\0';
      buffer[0x31] = '\0';
      buffer[0x32] = '\0';
      buffer[0x33] = '\0';
      buffer[0x34] = '\0';
      buffer[0x35] = '\0';
      buffer[0x36] = '\0';
      buffer[0x37] = '\0';
      buffer[0x38] = '\0';
      buffer[0x3c] = '\0';
      buffer[0x3d] = '\0';
      buffer[0x3e] = '\0';
      buffer[0x3f] = '\0';
      buffer[0x40] = '\0';
      buffer[0x41] = '\0';
      buffer[0x42] = '\0';
      buffer[0x43] = '\0';
      buffer[0x44] = '\0';
      buffer[0x45] = '\0';
      buffer[0x46] = '\0';
      buffer[0x47] = '\0';
      buffer[0x48] = '\0';
      buffer[0x49] = '\0';
      buffer[0x4a] = '\0';
      buffer[0x4b] = '\0';
      buffer[0x4c] = '\0';
      buffer[0x4d] = '\0';
      buffer[0x4e] = '\0';
      buffer[0x4f] = '\0';
      Converter::Impl::ResourceMeta::operator=(pmVar25,(ResourceMeta *)buffer);
      std::
      _Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::~_Vector_base((_Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                       *)(buffer + 0x10));
      pmVar25->stride = pRVar24->stride;
      pmVar25->storage = StorageClassPhysicalStorageBuffer;
      (pmVar25->physical_pointer_meta).coherent = pRVar24->coherent;
      bVar15 = pRVar24->rov;
      (pmVar25->physical_pointer_meta).rov = bVar15;
      pmVar25->kind = pRVar24->resource_kind;
      pmVar25->rov = bVar15;
      return true;
    }
    is_non_uniform_3 = false;
    IVar19 = pRVar24->var_id;
    if (IVar19 == 0) {
      pRVar39 = (pRVar24->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pRVar39 ==
          (pRVar24->var_alias_group).
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        IVar19 = 0;
      }
      else {
        IVar19 = pRVar39->var_id;
      }
    }
    local_1048 = instruction;
    SVar20 = get_resource_storage_class(impl,IVar19);
    DVar38 = DESCRIPTOR_QA_TYPE_STORAGE_IMAGE_BIT;
    if ((byte)(pRVar24->resource_kind - TypedBuffer) < 4) {
      DVar38 = DESCRIPTOR_QA_TYPE_STORAGE_TEXEL_BUFFER_BIT;
    }
    if (SVar20 == StorageClassStorageBuffer) {
      DVar38 = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
    }
    local_1058 = (pointer)0x0;
    loaded_id = 0;
    resource_id_1 = 0;
    resource_id = 0;
    _ptr_id = (pointer)0x0;
    pRStack_1060 = (pointer)0x0;
    _is_non_uniform = 0;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::reserve((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
               *)&ptr_id,
              (long)(pRVar24->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pRVar24->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
    instrumentation.resource_size_id = 0;
    instrumentation.bda_id = 0;
    instrumentation.elem_size_id = 0;
    IVar19 = pRVar24->var_id;
    if ((IVar19 != 0) &&
       (resource_id = IVar19,
       bVar15 = build_load_resource_handle
                          (impl,IVar19,pRVar24,DVar38,local_1048,instruction_offset,non_uniform,
                           &is_non_uniform_3,(Id *)&is_non_uniform,&loaded_id,&resource_id_1,
                           &instrumentation), !bVar15)) {
LAB_00153150:
      p_Var27 = get_thread_log_callback();
      if (p_Var27 != (LoggingCallback)0x0) {
        builtin_strncpy(buffer + 0x10,"AV r",4);
        buffer[0xc] = 'a';
        buffer[0xd] = 'd';
        buffer[0xe] = ' ';
        buffer[0xf] = 'U';
        goto LAB_0015317c;
      }
      __ptr = "[ERROR]: Failed to load UAV resource handle.\n";
      goto LAB_00153556;
    }
    pRVar6 = (pRVar24->var_alias_group).
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1040 = pBVar23;
    for (pRVar39 = (pRVar24->var_alias_group).
                   super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar39 != pRVar6;
        pRVar39 = pRVar39 + 1) {
      resource_id = pRVar39->var_id;
      bVar15 = build_load_resource_handle
                         (impl,resource_id,pRVar24,DVar38,local_1048,instruction_offset,non_uniform,
                          &is_non_uniform_3,(Id *)0x0,&loaded_id,&resource_id_1,&instrumentation);
      if (!bVar15) goto LAB_00153150;
      buffer._8_4_ = (pRVar39->declaration).vecsize;
      uVar5 = (pRVar39->declaration).type;
      uVar9 = (pRVar39->declaration).width;
      buffer._0_2_ = (undefined2)uVar5;
      buffer._2_2_ = (undefined2)((uint)uVar5 >> 0x10);
      buffer[0xc] = (undefined1)loaded_id;
      buffer[0xd] = loaded_id._1_1_;
      buffer[0xe] = loaded_id._2_1_;
      buffer[0xf] = loaded_id._3_1_;
      buffer._4_4_ = uVar9;
      std::
      vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::emplace_back<dxil_spv::Converter::Impl::RawDeclarationVariable>
                ((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                  *)&ptr_id,(RawDeclarationVariable *)buffer);
    }
    pmVar25 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->handle_to_resource_meta,&resource_id);
    IVar19 = get_offset_buffer_variable(impl,UAV,local_1048,resource_range);
    if (IVar19 == 0) {
      resource_id_1 = 0;
    }
    else {
      resource_id_1 =
           build_load_buffer_offset(impl,pRVar24,pmVar25,IVar19,resource_id_1,non_uniform);
    }
    pmVar26 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->handle_to_resource_meta,&loaded_id);
    Converter::Impl::ResourceMeta::operator=(pmVar26,pmVar25);
    bVar15 = is_non_uniform_3;
    pmVar26->non_uniform = is_non_uniform_3;
    pmVar26->index_offset_id = resource_id_1;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::_M_move_assign(&pmVar26->var_alias_group,&ptr_id);
    pBVar23 = local_1040;
    instruction_00 = local_1048;
    pmVar26->aliased = pRVar24->aliased;
    pmVar26->rov = pRVar24->rov;
    (pmVar26->physical_pointer_meta).coherent = pRVar24->coherent;
    (pmVar26->instrumentation).bda_id = instrumentation.bda_id;
    (pmVar26->instrumentation).elem_size_id = instrumentation.elem_size_id;
    (pmVar26->instrumentation).resource_size_id = instrumentation.resource_size_id;
    pmVar26->var_id = _is_non_uniform;
    if (pRVar24->bindless == true) {
      pmVar26->stride = pRVar24->stride;
    }
    if (bVar15 != false) {
      IVar19 = spv::Builder::getDerefTypeId(local_1040,resource_id);
      IVar19 = spv::Builder::getContainedTypeId(pBVar23,IVar19);
      CVar36 = CapabilityStorageBufferArrayNonUniformIndexing;
      if (pmVar26->storage != StorageClassStorageBuffer) {
        DVar21 = spv::Builder::getTypeDimensionality(pBVar23,IVar19);
        CVar36 = (uint)(DVar21 == DimBuffer) * 3 + CapabilityStorageImageArrayNonUniformIndexing;
      }
      spv::Builder::addCapability(pBVar23,CVar36);
      spv::Builder::addExtension(pBVar23,"SPV_EXT_descriptor_indexing");
    }
    buffer._0_2_ = SUB82(instruction_00,0);
    uVar11 = buffer._0_2_;
    buffer._2_2_ = (undefined2)((ulong)instruction_00 >> 0x10);
    uVar13 = buffer._2_2_;
    buffer._4_4_ = (undefined4)((ulong)instruction_00 >> 0x20);
    uVar14 = buffer._4_4_;
    sVar32 = std::
             _Hashtable<const_LLVMBC::Value_*,_const_LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(impl->llvm_values_using_update_counter)._M_h,(key_type *)buffer);
    if (sVar32 == 0) goto LAB_00153471;
    if (resource_range == 0xffffffff) {
      buffer._0_2_ = uVar11;
      buffer._2_2_ = uVar13;
      buffer._4_4_ = uVar14;
      pmVar33 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_annotate_handle_uses,(key_type *)buffer);
      reference = &pmVar33->counter_reference;
    }
    else {
      reference = (impl->uav_index_to_counter).
                  super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                  ._M_impl.super__Vector_impl_data._M_start + resource_range;
    }
    if (reference->bindless != true) {
      pmVar26->counter_var_id = reference->var_id;
LAB_0015346d:
      pmVar26->counter_is_physical_pointer = false;
      goto LAB_00153471;
    }
    if (reference->resource_kind == RawBuffer) {
      pBVar23 = Converter::Impl::builder(impl);
      IVar19 = spv::Builder::makeUintType(pBVar23,0x20);
      IVar19 = spv::Builder::makeVectorType(pBVar23,IVar19,2);
      IVar22 = spv::Builder::makePointer(pBVar23,StorageClassStorageBuffer,IVar19);
      pOVar34 = Converter::Impl::allocate(impl,OpAccessChain,IVar22);
      Operation::add_id(pOVar34,reference->var_id);
      IVar22 = spv::Builder::makeUintConstant(pBVar23,0,false);
      Operation::add_id(pOVar34,IVar22);
      if (reference->base_resource_is_array == false) {
        instruction_offset = (Value *)0x0;
      }
      IVar22 = build_bindless_heap_offset(impl,reference,0x100,instruction_offset);
      IVar22 = build_physical_address_indexing_from_ssbo(impl,IVar22);
      Operation::add_id(pOVar34,IVar22);
      Converter::Impl::add(impl,pOVar34,false);
      pOVar35 = Converter::Impl::allocate(impl,OpLoad,IVar19);
      Operation::add_id(pOVar35,pOVar34->id);
      Converter::Impl::add(impl,pOVar35,false);
      pmVar26->counter_var_id = pOVar35->id;
      pmVar26->counter_is_physical_pointer = true;
      (pmVar26->instrumentation).bda_id = 0;
      (pmVar26->instrumentation).elem_size_id = 0;
      (pmVar26->instrumentation).resource_size_id = 0;
      goto LAB_00153471;
    }
    bVar15 = build_load_resource_handle
                       (impl,reference->var_id,pRVar24,DESCRIPTOR_QA_TYPE_RAW_VA_BIT,instruction_00,
                        instruction_offset,non_uniform,&is_non_uniform_3,&pmVar26->counter_var_id,
                        (Id *)0x0,(Id *)0x0,(ResourceMetaInstrumentation *)0x0);
    if (bVar15) goto LAB_0015346d;
    p_Var27 = get_thread_log_callback();
    if (p_Var27 == (LoggingCallback)0x0) {
      __ptr = "[ERROR]: Failed to load UAV counter pointer.\n";
      goto LAB_00153556;
    }
    builtin_strncpy(buffer + 0x10,"AV counter po",0xd);
    builtin_strncpy(buffer + 0xc,"ad U",4);
    uVar31 = 0xa2e7265746e69;
    break;
  case 2:
    pRVar24 = get_resource_reference(impl,CBV,instruction,resource_range);
    uVar14 = buffer._4_4_;
    uVar13 = buffer._2_2_;
    uVar11 = buffer._0_2_;
    lVar37 = (long)pRVar24->local_root_signature_entry;
    if (lVar37 < 0) {
      if (pRVar24->root_descriptor == true) goto LAB_0015272a;
      pLVar29 = (pointer)0x0;
    }
    else {
      pLVar29 = (impl->local_root_signature).
                super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pLVar29[lVar37].type == Descriptor) {
LAB_0015272a:
        IVar19 = build_root_descriptor_load_physical_pointer(impl,pRVar24);
        _ptr_id = (pointer)CONCAT44(uStack_1064,IVar19);
        pmVar25 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->handle_to_resource_meta,&ptr_id);
        buffer[0] = '\0';
        buffer[1] = '\0';
        buffer[4] = '\0';
        buffer[5] = '\0';
        buffer[6] = '\0';
        buffer[7] = '\0';
        buffer[8] = '\0';
        buffer[9] = '\0';
        buffer[10] = '\0';
        buffer[0xb] = '\0';
        buffer[0xc] = '\0';
        buffer[0xd] = '\0';
        buffer[0xe] = '\0';
        buffer[0xf] = '\0';
        buffer[0x10] = '\0';
        buffer[0x11] = '\0';
        buffer[0x12] = '\0';
        buffer[0x13] = '\0';
        buffer[0x14] = '\0';
        buffer[0x15] = '\0';
        buffer[0x16] = '\0';
        buffer[0x17] = '\0';
        buffer[0x18] = '\0';
        buffer[0x19] = '\0';
        buffer[0x1a] = '\0';
        buffer[0x1b] = '\0';
        buffer[0x1c] = '\0';
        buffer[0x1d] = '\0';
        buffer[0x1e] = '\0';
        buffer[0x1f] = '\0';
        buffer[0x20] = '\0';
        buffer[0x21] = '\0';
        buffer[0x22] = '\0';
        buffer[0x23] = '\0';
        buffer[0x24] = '\0';
        buffer[0x25] = '\0';
        buffer[0x26] = '\0';
        buffer[0x27] = '\0';
        buffer[0x28] = '\0';
        buffer[0x29] = '\0';
        buffer[0x2a] = '\0';
        buffer[0x2b] = '\0';
        buffer[0x2c] = '\0';
        buffer[0x2d] = '\0';
        buffer[0x2e] = '\0';
        buffer[0x2f] = '\0';
        buffer[0x30] = '\0';
        buffer[0x31] = '\0';
        buffer[0x32] = '\0';
        buffer[0x33] = '\0';
        buffer[0x34] = '\0';
        buffer[0x35] = '\0';
        buffer[0x36] = '\0';
        buffer[0x37] = '\0';
        buffer[0x38] = '\0';
        buffer[0x3c] = '\0';
        buffer[0x3d] = '\0';
        buffer[0x3e] = '\0';
        buffer[0x3f] = '\0';
        buffer[0x40] = '\0';
        buffer[0x41] = '\0';
        buffer[0x42] = '\0';
        buffer[0x43] = '\0';
        buffer[0x44] = '\0';
        buffer[0x45] = '\0';
        buffer[0x46] = '\0';
        buffer[0x47] = '\0';
        buffer[0x48] = '\0';
        buffer[0x49] = '\0';
        buffer[0x4a] = '\0';
        buffer[0x4b] = '\0';
        buffer[0x4c] = '\0';
        buffer[0x4d] = '\0';
        buffer[0x4e] = '\0';
        buffer[0x4f] = '\0';
        Converter::Impl::ResourceMeta::operator=(pmVar25,(ResourceMeta *)buffer);
        std::
        _Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::~_Vector_base((_Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                         *)(buffer + 0x10));
        pmVar25->stride = pRVar24->stride;
        pmVar25->storage = StorageClassPhysicalStorageBuffer;
        (pmVar25->physical_pointer_meta).nonwritable = true;
        pmVar25->kind = pRVar24->resource_kind;
        IVar19 = ptr_id;
        goto LAB_001527b4;
      }
      pLVar29 = pLVar29 + lVar37;
    }
    IVar19 = pRVar24->var_id;
    buffer._0_2_ = SUB82(instruction,0);
    uVar12 = buffer._0_2_;
    buffer._2_2_ = (undefined2)((ulong)instruction >> 0x10);
    buffer._4_4_ = (undefined4)((ulong)instruction >> 0x20);
    uVar10 = buffer._4_4_;
    if ((IVar19 != 0) && (IVar19 == impl->root_constant_id)) {
      Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar19);
      uVar1 = pRVar24->push_constant_member;
      pmVar30 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_root_member_offset,(key_type *)buffer);
      *pmVar30 = uVar1;
      return true;
    }
    if ((pLVar29 != (pointer)0x0) && (pLVar29->type == Constants)) {
      IVar19 = build_shader_record_access_chain(impl,pRVar24->local_root_signature_entry);
      _ptr_id = (pointer)CONCAT44(uStack_1064,IVar19);
      pmVar25 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&ptr_id);
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      buffer[0x18] = '\0';
      buffer[0x19] = '\0';
      buffer[0x1a] = '\0';
      buffer[0x1b] = '\0';
      buffer[0x1c] = '\0';
      buffer[0x1d] = '\0';
      buffer[0x1e] = '\0';
      buffer[0x1f] = '\0';
      buffer[0x20] = '\0';
      buffer[0x21] = '\0';
      buffer[0x22] = '\0';
      buffer[0x23] = '\0';
      buffer[0x24] = '\0';
      buffer[0x25] = '\0';
      buffer[0x26] = '\0';
      buffer[0x27] = '\0';
      buffer[0x28] = '\0';
      buffer[0x29] = '\0';
      buffer[0x2a] = '\0';
      buffer[0x2b] = '\0';
      buffer[0x2c] = '\0';
      buffer[0x2d] = '\0';
      buffer[0x2e] = '\0';
      buffer[0x2f] = '\0';
      buffer[0x30] = '\0';
      buffer[0x31] = '\0';
      buffer[0x32] = '\0';
      buffer[0x33] = '\0';
      buffer[0x34] = '\0';
      buffer[0x35] = '\0';
      buffer[0x36] = '\0';
      buffer[0x37] = '\0';
      buffer[0x38] = '\0';
      buffer[0x3c] = '\0';
      buffer[0x3d] = '\0';
      buffer[0x3e] = '\0';
      buffer[0x3f] = '\0';
      buffer[0x40] = '\0';
      buffer[0x41] = '\0';
      buffer[0x42] = '\0';
      buffer[0x43] = '\0';
      buffer[0x44] = '\0';
      buffer[0x45] = '\0';
      buffer[0x46] = '\0';
      buffer[0x47] = '\0';
      buffer[0x48] = '\0';
      buffer[0x49] = '\0';
      buffer[0x4a] = '\0';
      buffer[0x4b] = '\0';
      buffer[0x4c] = '\0';
      buffer[0x4d] = '\0';
      buffer[0x4e] = '\0';
      buffer[0x4f] = '\0';
      Converter::Impl::ResourceMeta::operator=(pmVar25,(ResourceMeta *)buffer);
      std::
      _Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::~_Vector_base((_Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                       *)(buffer + 0x10));
      pmVar25->storage = StorageClassShaderRecordBufferKHR;
      pmVar25->kind = CBuffer;
      mVar2 = pRVar24->local_root_signature_entry;
      buffer._0_2_ = uVar12;
      buffer._4_4_ = uVar10;
      pmVar30 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_root_member_offset,(key_type *)buffer);
      *pmVar30 = mVar2;
      IVar19 = ptr_id;
LAB_001527b4:
      Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar19);
      return true;
    }
    resource_id = resource_id & 0xffffff00;
    bVar16 = (impl->options).bindless_cbv_ssbo_emulation & pRVar24->bindless;
    uVar10 = 2;
    if (bVar16 != 0) {
      uVar10 = 0xc;
    }
    DVar38 = (uint)bVar16 * 4 + DESCRIPTOR_QA_TYPE_UNIFORM_BUFFER_BIT;
    local_1058 = (pointer)0x0;
    loaded_id = 0;
    _ptr_id = (pointer)0x0;
    pRStack_1060 = (pointer)0x0;
    resource_id_1 = 0;
    buffer._0_2_ = uVar11;
    buffer._2_2_ = uVar13;
    buffer._4_4_ = uVar14;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::reserve((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
               *)&ptr_id,
              (long)(pRVar24->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pRVar24->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
    instrumentation.resource_size_id = 0;
    instrumentation.bda_id = 0;
    instrumentation.elem_size_id = 0;
    IVar19 = pRVar24->var_id;
    if ((IVar19 == 0) ||
       (resource_id_1 = IVar19,
       bVar15 = build_load_resource_handle
                          (impl,IVar19,pRVar24,DVar38,instruction,instruction_offset,non_uniform,
                           (bool *)&resource_id,(Id *)0x0,&loaded_id,(Id *)0x0,&instrumentation),
       bVar15)) {
      local_1048 = (CallInst *)CONCAT44(local_1048._4_4_,uVar10);
      pRVar6 = (pRVar24->var_alias_group).
               super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_1040 = pBVar23;
      for (pRVar39 = (pRVar24->var_alias_group).
                     super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                     ._M_impl.super__Vector_impl_data._M_start; pRVar39 != pRVar6;
          pRVar39 = pRVar39 + 1) {
        resource_id_1 = pRVar39->var_id;
        bVar15 = build_load_resource_handle
                           (impl,resource_id_1,pRVar24,DVar38,instruction,instruction_offset,
                            non_uniform,(bool *)&resource_id,(Id *)0x0,&loaded_id,(Id *)0x0,
                            &instrumentation);
        if (!bVar15) goto LAB_00152983;
        buffer._8_4_ = (pRVar39->declaration).vecsize;
        uVar3 = (pRVar39->declaration).type;
        uVar7 = (pRVar39->declaration).width;
        buffer._0_2_ = (undefined2)uVar3;
        buffer._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
        buffer[0xc] = (undefined1)loaded_id;
        buffer[0xd] = loaded_id._1_1_;
        buffer[0xe] = loaded_id._2_1_;
        buffer[0xf] = loaded_id._3_1_;
        buffer._4_4_ = uVar7;
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::emplace_back<dxil_spv::Converter::Impl::RawDeclarationVariable>
                  ((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    *)&ptr_id,(RawDeclarationVariable *)buffer);
      }
      pmVar25 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&resource_id_1);
      pmVar26 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&loaded_id);
      Converter::Impl::ResourceMeta::operator=(pmVar26,pmVar25);
      bVar15 = resource_id._0_1_;
      pmVar26->non_uniform = resource_id._0_1_;
      pmVar26->storage = (StorageClass)local_1048;
      std::
      vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::_M_move_assign(&pmVar26->var_alias_group,&ptr_id);
      pBVar23 = local_1040;
      pmVar26->kind = CBuffer;
      (pmVar26->instrumentation).bda_id = instrumentation.bda_id;
      (pmVar26->instrumentation).elem_size_id = instrumentation.elem_size_id;
      (pmVar26->instrumentation).resource_size_id = instrumentation.resource_size_id;
      if (bVar15 != true) goto LAB_00153471;
      spv::Builder::addCapability
                (local_1040,(uint)bVar16 * 2 + CapabilityUniformBufferArrayNonUniformIndexing);
      goto LAB_00152fc7;
    }
LAB_00152983:
    p_Var27 = get_thread_log_callback();
    if (p_Var27 == (LoggingCallback)0x0) {
      __ptr = "[ERROR]: Failed to load CBV resource handle.\n";
      goto LAB_00153556;
    }
    builtin_strncpy(buffer + 0x10,"BV r",4);
    buffer[0xc] = 'a';
    buffer[0xd] = 'd';
    buffer[0xe] = ' ';
    buffer[0xf] = 'C';
LAB_0015317c:
    builtin_strncpy(buffer + 0x14,"esource h",9);
    uVar31 = 0xa2e656c646e61;
    break;
  case 3:
    pRVar24 = get_resource_reference(impl,Sampler,instruction,resource_range);
    _ptr_id = (pointer)CONCAT44(uStack_1064,pRVar24->var_id);
    loaded_id = loaded_id & 0xffffff00;
    instrumentation._0_8_ = (ulong)instrumentation.elem_size_id << 0x20;
    bVar15 = build_load_resource_handle
                       (impl,pRVar24->var_id,pRVar24,DESCRIPTOR_QA_TYPE_SAMPLER_BIT,instruction,
                        instruction_offset,non_uniform,(bool *)&loaded_id,(Id *)0x0,
                        &instrumentation.bda_id,(Id *)0x0,(ResourceMetaInstrumentation *)0x0);
    if (!bVar15) {
      p_Var27 = get_thread_log_callback();
      if (p_Var27 != (LoggingCallback)0x0) {
        builtin_strncpy(buffer + 0x20,"handle.\n",9);
        builtin_strncpy(buffer + 0x10,"ampler resource ",0x10);
        builtin_strncpy(buffer,"Failed to load S",0x10);
        pvVar28 = get_thread_log_callback_userdata();
        (*p_Var27)(pvVar28,Error,buffer);
        return false;
      }
      fwrite("[ERROR]: Failed to load Sampler resource handle.\n",0x31,1,_stderr);
      fflush(_stderr);
      return false;
    }
    pmVar25 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->handle_to_resource_meta,&instrumentation.bda_id);
    pmVar26 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->handle_to_resource_meta,&ptr_id);
    Converter::Impl::ResourceMeta::operator=(pmVar25,pmVar26);
    pmVar25->non_uniform = (bool)(undefined1)loaded_id;
    if ((bool)(undefined1)loaded_id != true) {
      return true;
    }
    spv::Builder::addCapability(pBVar23,CapabilitySampledImageArrayNonUniformIndexing);
    spv::Builder::addExtension(pBVar23,"SPV_EXT_descriptor_indexing");
    return true;
  default:
    goto switchD_0015238f_default;
  }
  builtin_strncpy(buffer,"Failed to lo",0xc);
  buffer._29_3_ = (undefined3)uVar31;
  buffer._32_4_ = (undefined4)((ulong)uVar31 >> 0x18);
  buffer[0x24] = '\0';
  pvVar28 = get_thread_log_callback_userdata();
  (*p_Var27)(pvVar28,Error,buffer);
LAB_0015319e:
  std::
  _Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ::~_Vector_base((_Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   *)&ptr_id);
switchD_0015238f_default:
  return false;
}

Assistant:

static bool emit_create_handle(Converter::Impl &impl, const llvm::CallInst *instruction,
                               DXIL::ResourceType resource_type, unsigned resource_range,
                               llvm::Value *instruction_offset, bool non_uniform)
{
	auto &builder = impl.builder();
	switch (resource_type)
	{
	case DXIL::ResourceType::SRV:
	{
		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);

		if (resource_is_physical_rtas(impl, reference))
		{
			spv::Id ptr_id = build_load_physical_rtas(impl, reference, instruction_offset, non_uniform);
			impl.rewrite_value(instruction, ptr_id);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.storage = spv::StorageClassGeneric;
			meta.kind = DXIL::ResourceKind::RTAccelerationStructure;
		}
		else if (resource_is_physical_pointer(impl, reference))
		{
			spv::Id ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
			impl.rewrite_value(instruction, ptr_id);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.stride = reference.stride;
			meta.storage = spv::StorageClassPhysicalStorageBuffer;
			meta.physical_pointer_meta.nonwritable = true;
			meta.kind = reference.resource_kind;
		}
		else
		{
			bool is_non_uniform = false;

			spv::Id representative_var_id = reference.var_id;
			if (!representative_var_id && !reference.var_alias_group.empty())
				representative_var_id = reference.var_alias_group.front().var_id;
			auto storage = get_resource_storage_class(impl, representative_var_id);

			DescriptorQATypeFlagBits descriptor_type;
			if (storage == spv::StorageClassStorageBuffer)
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
			else if (resource_kind_is_buffer(reference.resource_kind))
				descriptor_type = DESCRIPTOR_QA_TYPE_UNIFORM_TEXEL_BUFFER_BIT;
			else if (reference.resource_kind == DXIL::ResourceKind::RTAccelerationStructure)
				descriptor_type = DESCRIPTOR_QA_TYPE_RT_ACCELERATION_STRUCTURE_BIT;
			else
				descriptor_type = DESCRIPTOR_QA_TYPE_SAMPLED_IMAGE_BIT;

			Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
			spv::Id loaded_id = 0;
			spv::Id offset_id = 0;
			spv::Id resource_id = 0;
			raw_declarations.reserve(reference.var_alias_group.size());

			Converter::Impl::ResourceMetaInstrumentation instrumentation = {};

			if (reference.var_id)
			{
				resource_id = reference.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type, instruction,
												instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load SRV resource handle.\n");
					return false;
				}
			}

			for (auto &alias : reference.var_alias_group)
			{
				resource_id = alias.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type,
												instruction, instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load SRV resource handle.\n");
					return false;
				}

				raw_declarations.push_back({ alias.declaration, loaded_id });
			}

			auto &incoming_meta = impl.handle_to_resource_meta[resource_id];

			spv::Id offset_buffer_id = get_offset_buffer_variable(impl, resource_type, instruction, resource_range);
			if (offset_buffer_id)
			{
				offset_id = build_load_buffer_offset(impl, reference, incoming_meta,
				                                     offset_buffer_id, offset_id, non_uniform);
			}
			else
				offset_id = 0;

			auto &meta = impl.handle_to_resource_meta[loaded_id];
			meta = incoming_meta;
			meta.non_uniform = is_non_uniform;
			meta.index_offset_id = offset_id;
			meta.var_alias_group = std::move(raw_declarations);
			meta.aliased = reference.aliased;
			meta.physical_pointer_meta.nonwritable = true;
			meta.instrumentation = instrumentation;

			// The base array variable does not know what the stride is, promote that state here.
			if (reference.bindless)
				meta.stride = reference.stride;

			if (is_non_uniform)
			{
				spv::Id type_id = builder.getDerefTypeId(resource_id);
				type_id = builder.getContainedTypeId(type_id);

				if (builder.getTypeClass(type_id) != spv::OpTypeAccelerationStructureKHR)
				{
					if (meta.storage == spv::StorageClassStorageBuffer)
						builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexing);
					else if (builder.getTypeDimensionality(type_id) == spv::DimBuffer)
						builder.addCapability(spv::CapabilityUniformTexelBufferArrayNonUniformIndexing);
					else
						builder.addCapability(spv::CapabilitySampledImageArrayNonUniformIndexingEXT);
				}
				builder.addExtension("SPV_EXT_descriptor_indexing");
			}
		}
		break;
	}

	case DXIL::ResourceType::UAV:
	{
		if (resource_range == impl.ags.uav_magic_resource_type_index)
		{
			// Resources tied to constant uints are considered "magic".
			if (impl.ags.magic_ptr_id == 0)
			{
				spv::Id dummy_value = impl.spirv_module.allocate_id();
				impl.ags.magic_ptr_id = dummy_value;
			}

			impl.rewrite_value(instruction, impl.ags.magic_ptr_id);
			break;
		}

		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);

		if (resource_is_physical_pointer(impl, reference))
		{
			spv::Id ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
			impl.rewrite_value(instruction, ptr_id);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.stride = reference.stride;
			meta.storage = spv::StorageClassPhysicalStorageBuffer;
			meta.physical_pointer_meta.coherent = reference.coherent;
			meta.physical_pointer_meta.rov = reference.rov;
			meta.kind = reference.resource_kind;
			meta.rov = reference.rov;
		}
		else
		{
			bool is_non_uniform = false;

			spv::Id representative_var_id = reference.var_id;
			if (!representative_var_id && !reference.var_alias_group.empty())
				representative_var_id = reference.var_alias_group.front().var_id;
			auto storage = get_resource_storage_class(impl, representative_var_id);

			DescriptorQATypeFlagBits descriptor_type;
			if (storage == spv::StorageClassStorageBuffer)
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
			else if (resource_kind_is_buffer(reference.resource_kind))
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_TEXEL_BUFFER_BIT;
			else
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_IMAGE_BIT;

			Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
			spv::Id loaded_id = 0;
			spv::Id offset_id = 0;
			spv::Id resource_id = 0;
			spv::Id resource_ptr_id = 0;
			raw_declarations.reserve(reference.var_alias_group.size());

			Converter::Impl::ResourceMetaInstrumentation instrumentation = {};

			if (reference.var_id)
			{
				resource_id = reference.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type, instruction,
				                                instruction_offset, non_uniform, is_non_uniform, &resource_ptr_id,
				                                &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load UAV resource handle.\n");
					return false;
				}
			}

			for (auto &alias : reference.var_alias_group)
			{
				resource_id = alias.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type,
												instruction, instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load UAV resource handle.\n");
					return false;
				}

				raw_declarations.push_back({ alias.declaration, loaded_id });
			}

			auto &incoming_meta = impl.handle_to_resource_meta[resource_id];

			spv::Id offset_buffer_id = get_offset_buffer_variable(impl, resource_type, instruction, resource_range);
			if (offset_buffer_id)
			{
				offset_id = build_load_buffer_offset(impl, reference, incoming_meta,
				                                     offset_buffer_id, offset_id, non_uniform);
			}
			else
				offset_id = 0;

			auto &meta = impl.handle_to_resource_meta[loaded_id];
			meta = incoming_meta;
			meta.non_uniform = is_non_uniform;
			meta.index_offset_id = offset_id;
			meta.var_alias_group = std::move(raw_declarations);
			meta.aliased = reference.aliased;
			meta.rov = reference.rov;
			meta.physical_pointer_meta.coherent = reference.coherent;
			meta.instrumentation = instrumentation;

			// Image atomics requires the pointer to image and not OpTypeImage directly.
			meta.var_id = resource_ptr_id;

			// The base array variable does not know what the stride is, promote that state here.
			if (reference.bindless)
				meta.stride = reference.stride;

			if (is_non_uniform)
			{
				spv::Id type_id = builder.getDerefTypeId(resource_id);
				type_id = builder.getContainedTypeId(type_id);

				if (meta.storage == spv::StorageClassStorageBuffer)
					builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexing);
				else if (builder.getTypeDimensionality(type_id) == spv::DimBuffer)
					builder.addCapability(spv::CapabilityStorageTexelBufferArrayNonUniformIndexing);
				else
					builder.addCapability(spv::CapabilityStorageImageArrayNonUniformIndexing);
				builder.addExtension("SPV_EXT_descriptor_indexing");
			}

			if (impl.llvm_values_using_update_counter.count(instruction) != 0)
			{
				auto &counter_reference = get_resource_counter_reference(impl, instruction, resource_range);

				if (counter_reference.bindless)
				{
					if (counter_reference.resource_kind == DXIL::ResourceKind::RawBuffer)
					{
						meta.counter_var_id = build_load_physical_pointer(impl, counter_reference, instruction_offset, instruction);
						meta.counter_is_physical_pointer = true;
						// Don't support this since the physical pointer we get from heap is actually the counter.
						meta.instrumentation = {};
					}
					else
					{
						if (!build_load_resource_handle(impl, counter_reference.var_id, reference,
						                                DESCRIPTOR_QA_TYPE_RAW_VA_BIT,
						                                instruction, instruction_offset, non_uniform,
						                                is_non_uniform, &meta.counter_var_id, nullptr, nullptr, nullptr))
						{
							LOGE("Failed to load UAV counter pointer.\n");
							return false;
						}
						meta.counter_is_physical_pointer = false;
					}
				}
				else
				{
					meta.counter_var_id = counter_reference.var_id;
					meta.counter_is_physical_pointer = false;
				}
			}
		}
		break;
	}

	case DXIL::ResourceType::CBV:
	{
		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);
		const LocalRootSignatureEntry *local_root_signature_entry = nullptr;
		if (reference.local_root_signature_entry >= 0)
			local_root_signature_entry = &impl.local_root_signature[reference.local_root_signature_entry];

		// Special case root constants since these resources point directly to
		// the push constant block or SBT and not to any concrete resource,
		// so we cannot deduce storage classes properly.

		if (resource_is_physical_pointer(impl, reference))
		{
			spv::Id ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.stride = reference.stride;
			meta.storage = spv::StorageClassPhysicalStorageBuffer;
			meta.physical_pointer_meta.nonwritable = true;
			meta.kind = reference.resource_kind;
			impl.rewrite_value(instruction, ptr_id);
		}
		else if (reference.var_id != 0 && reference.var_id == impl.root_constant_id)
		{
			// Point directly to root constants.
			impl.rewrite_value(instruction, reference.var_id);
			unsigned member_offset = reference.push_constant_member;
			impl.handle_to_root_member_offset[instruction] = member_offset;
		}
		else if (local_root_signature_entry && local_root_signature_entry->type == LocalRootSignatureType::Constants)
		{
			// Access chain into the desired member once.
			spv::Id id = build_shader_record_access_chain(impl, reference.local_root_signature_entry);

			auto &meta = impl.handle_to_resource_meta[id];
			meta = {};
			meta.storage = spv::StorageClassShaderRecordBufferKHR;
			meta.kind = DXIL::ResourceKind::CBuffer;
			impl.handle_to_root_member_offset[instruction] = reference.local_root_signature_entry;
			impl.rewrite_value(instruction, id);
		}
		else
		{
			bool is_non_uniform = false;

			bool ssbo = reference.bindless && impl.options.bindless_cbv_ssbo_emulation;
			auto storage = ssbo ? spv::StorageClassStorageBuffer : spv::StorageClassUniform;
			auto descriptor_type = ssbo ? DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT : DESCRIPTOR_QA_TYPE_UNIFORM_BUFFER_BIT;

			Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
			spv::Id loaded_id = 0;
			spv::Id resource_id = 0;
			raw_declarations.reserve(reference.var_alias_group.size());

			Converter::Impl::ResourceMetaInstrumentation instrumentation = {};

			if (reference.var_id)
			{
				resource_id = reference.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type, instruction,
												instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, nullptr, &instrumentation))
				{
					LOGE("Failed to load CBV resource handle.\n");
					return false;
				}
			}

			for (auto &alias : reference.var_alias_group)
			{
				resource_id = alias.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type,
												instruction, instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, nullptr, &instrumentation))
				{
					LOGE("Failed to load CBV resource handle.\n");
					return false;
				}

				raw_declarations.push_back({ alias.declaration, loaded_id });
			}

			auto &incoming_meta = impl.handle_to_resource_meta[resource_id];

			auto &meta = impl.handle_to_resource_meta[loaded_id];
			meta = incoming_meta;
			meta.non_uniform = is_non_uniform;
			meta.storage = storage;
			meta.var_alias_group = std::move(raw_declarations);
			meta.kind = DXIL::ResourceKind::CBuffer;
			meta.instrumentation = instrumentation;

			if (is_non_uniform)
			{
				if (ssbo)
					builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexingEXT);
				else
					builder.addCapability(spv::CapabilityUniformBufferArrayNonUniformIndexingEXT);
				builder.addExtension("SPV_EXT_descriptor_indexing");
			}
		}
		break;
	}

	case DXIL::ResourceType::Sampler:
	{
		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);
		spv::Id base_sampler_id = reference.var_id;

		bool is_non_uniform = false;
		spv::Id loaded_id = 0;
		if (!build_load_resource_handle(impl, base_sampler_id, reference, DESCRIPTOR_QA_TYPE_SAMPLER_BIT, instruction,
		                                instruction_offset, non_uniform, is_non_uniform, nullptr, &loaded_id, nullptr, nullptr))
		{
			LOGE("Failed to load Sampler resource handle.\n");
			return false;
		}

		auto &meta = impl.handle_to_resource_meta[loaded_id];
		meta = impl.handle_to_resource_meta[base_sampler_id];
		meta.non_uniform = is_non_uniform;

		if (is_non_uniform)
		{
			builder.addCapability(spv::CapabilitySampledImageArrayNonUniformIndexingEXT);
			builder.addExtension("SPV_EXT_descriptor_indexing");
		}
		break;
	}

	default:
		return false;
	}

	return true;
}